

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_array_reverse(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  JSValue val;
  JSValue val_00;
  bool bVar4;
  int iVar5;
  int iVar6;
  JSValueUnion JVar7;
  undefined4 extraout_var;
  JSValueUnion JVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  int *piVar12;
  ulong uVar13;
  long idx;
  long idx_00;
  JSValue v;
  JSValue obj;
  JSValue JVar14;
  int64_t len;
  JSValue hval;
  JSValueUnion local_68;
  int64_t iStack_60;
  JSValueUnion local_50;
  ulong local_48;
  JSValueUnion local_40;
  int64_t local_38;
  
  local_68.int32 = 0;
  iStack_60 = 3;
  obj = JS_ToObject(ctx,this_val);
  uVar11 = (uint)obj.tag;
  JVar7 = obj.u;
  uVar9 = uVar11;
  JVar8._0_4_ = js_get_length64(ctx,(int64_t *)&local_48,obj);
  JVar8._4_4_ = extraout_var;
  if (JVar8._0_4_ == 0) {
    if (((uVar11 == 0xffffffff) && (JVar8 = JVar7, *(short *)((long)JVar7.ptr + 6) == 2)) &&
       ((*(byte *)((long)JVar7.ptr + 5) & 8) != 0)) {
      uVar9 = *(uint *)((long)JVar7.ptr + 0x40);
      JVar8 = (JSValueUnion)((JSValueUnion *)((long)JVar7.ptr + 0x38))->ptr;
      bVar4 = true;
    }
    else {
      bVar4 = false;
    }
    if ((bVar4) && (local_48 == uVar9)) {
      if (1 < uVar9) {
        uVar10 = (ulong)(uVar9 - 1);
        piVar12 = (int *)(uVar10 * 0x10 + (long)JVar8.ptr);
        uVar13 = 0;
        do {
          uVar10 = uVar10 - 1;
          uVar1 = *JVar8.ptr;
          uVar2 = *(undefined8 *)((long)JVar8.ptr + 8);
          uVar3 = *(undefined8 *)(piVar12 + 2);
          *(undefined8 *)JVar8.ptr = *(undefined8 *)piVar12;
          *(undefined8 *)((long)JVar8.ptr + 8) = uVar3;
          *(undefined8 *)piVar12 = uVar1;
          *(undefined8 *)(piVar12 + 2) = uVar2;
          uVar13 = uVar13 + 1;
          JVar8.float64 = JVar8.float64 + 0x10;
          piVar12 = piVar12 + -4;
        } while (uVar13 < (uVar10 & 0xffffffff));
      }
    }
    else if (1 < (long)local_48) {
      idx = local_48 - 1;
      idx_00 = 0;
      local_40 = JVar7;
      do {
        iVar5 = JS_TryGetPropertyInt64(ctx,obj,idx_00,(JSValue *)&local_68);
        if (iVar5 < 0) goto LAB_00166958;
        iVar6 = JS_TryGetPropertyInt64(ctx,obj,idx,(JSValue *)&local_40);
        if (iVar6 < 0) goto LAB_00166958;
        if (iVar6 == 0) {
          if (iVar5 != 0) {
            iVar5 = JS_DeletePropertyInt64(ctx,obj,idx_00,0x4000);
            if (-1 < iVar5) goto LAB_00166af4;
            goto LAB_00166958;
          }
        }
        else {
          val_00.tag = local_38;
          val_00.u.ptr = local_40.ptr;
          iVar6 = JS_SetPropertyInt64(ctx,obj,idx_00,val_00);
          if (iVar6 < 0) goto LAB_00166958;
          if (iVar5 == 0) {
            iVar5 = JS_DeletePropertyInt64(ctx,obj,idx,0x4000);
          }
          else {
LAB_00166af4:
            val.u._4_4_ = local_68._4_4_;
            val.u.int32 = local_68.int32;
            val.tag = iStack_60;
            iVar5 = JS_SetPropertyInt64(ctx,obj,idx,val);
            local_68.int32 = 0;
            iStack_60 = 3;
          }
          if (iVar5 < 0) goto LAB_00166958;
        }
        idx_00 = idx_00 + 1;
        idx = idx + -1;
      } while (idx_00 < idx);
    }
    uVar10 = (ulong)JVar7.ptr & 0xffffffff00000000;
  }
  else {
LAB_00166958:
    local_50._4_4_ = local_68._4_4_;
    local_50.int32 = local_68.int32;
    if ((0xfffffff4 < (uint)iStack_60) &&
       (iVar5 = *local_50.ptr, *(int *)local_50.ptr = iVar5 + -1, iVar5 < 2)) {
      v.tag = iStack_60;
      v.u.ptr = local_50.ptr;
      __JS_FreeValueRT(ctx->rt,v);
    }
    if ((0xfffffff4 < uVar11) && (iVar5 = *JVar7.ptr, *(int *)JVar7.ptr = iVar5 + -1, iVar5 < 2)) {
      local_50 = JVar7;
      __JS_FreeValueRT(ctx->rt,obj);
    }
    obj = (JSValue)(ZEXT816(6) << 0x40);
    uVar10 = 0;
  }
  JVar14.u.ptr = (void *)((ulong)obj.u.ptr & 0xffffffff | uVar10);
  JVar14.tag = obj.tag;
  return JVar14;
}

Assistant:

static JSValue js_array_reverse(JSContext *ctx, JSValueConst this_val,
                                int argc, JSValueConst *argv)
{
    JSValue obj, lval, hval;
    JSValue *arrp;
    int64_t len, l, h;
    int l_present, h_present;
    uint32_t count32;

    lval = JS_UNDEFINED;
    obj = JS_ToObject(ctx, this_val);
    if (js_get_length64(ctx, &len, obj))
        goto exception;

    /* Special case fast arrays */
    if (js_get_fast_array(ctx, obj, &arrp, &count32) && count32 == len) {
        uint32_t ll, hh;

        if (count32 > 1) {
            for (ll = 0, hh = count32 - 1; ll < hh; ll++, hh--) {
                lval = arrp[ll];
                arrp[ll] = arrp[hh];
                arrp[hh] = lval;
            }
        }
        return obj;
    }

    for (l = 0, h = len - 1; l < h; l++, h--) {
        l_present = JS_TryGetPropertyInt64(ctx, obj, l, &lval);
        if (l_present < 0)
            goto exception;
        h_present = JS_TryGetPropertyInt64(ctx, obj, h, &hval);
        if (h_present < 0)
            goto exception;
        if (h_present) {
            if (JS_SetPropertyInt64(ctx, obj, l, hval) < 0)
                goto exception;

            if (l_present) {
                if (JS_SetPropertyInt64(ctx, obj, h, lval) < 0) {
                    lval = JS_UNDEFINED;
                    goto exception;
                }
                lval = JS_UNDEFINED;
            } else {
                if (JS_DeletePropertyInt64(ctx, obj, h, JS_PROP_THROW) < 0)
                    goto exception;
            }
        } else {
            if (l_present) {
                if (JS_DeletePropertyInt64(ctx, obj, l, JS_PROP_THROW) < 0)
                    goto exception;
                if (JS_SetPropertyInt64(ctx, obj, h, lval) < 0) {
                    lval = JS_UNDEFINED;
                    goto exception;
                }
                lval = JS_UNDEFINED;
            }
        }
    }
    return obj;

 exception:
    JS_FreeValue(ctx, lval);
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}